

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_user_geometry.h
# Opt level: O1

PrimInfoMB * __thiscall
embree::sse2::UserGeometryISA::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,UserGeometryISA *this,mvector<PrimRefMB> *prims,
          BBox1f *t0t1,range<unsigned_long> *r,size_t k,uint geomID)

{
  PrimRefMB *pPVar1;
  BBox1f BVar2;
  PrimRefMB *pPVar3;
  undefined1 auVar4 [16];
  int iVar5;
  float fVar6;
  undefined4 uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  float fVar11;
  bool bVar12;
  float fVar13;
  undefined1 auVar14 [12];
  undefined1 extraout_var [12];
  undefined1 auVar15 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar16;
  float fVar17;
  uint uVar18;
  uint uVar23;
  undefined1 auVar19 [12];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar22;
  float fVar24;
  undefined1 auVar25 [16];
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [12];
  undefined1 auVar29 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  BBox<embree::Vec3fa> bupper1;
  BBox3fa box;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  float local_23c;
  float local_238;
  ulong local_200;
  undefined8 local_1f8;
  float fStack_1f0;
  float fStack_1ec;
  undefined8 local_1e8;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  unsigned_long local_1c0;
  size_t local_1b8;
  ulong local_1b0;
  size_t local_1a8;
  BBox1f *local_1a0;
  undefined1 local_198 [8];
  float fStack_190;
  float fStack_18c;
  undefined1 local_188 [8];
  float fStack_180;
  float fStack_17c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_178;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_168;
  BBox1f local_158;
  undefined8 uStack_150;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  PrimInfoMB *local_100;
  mvector<PrimRefMB> *local_f8;
  range<unsigned_long> *local_f0;
  undefined8 local_e8;
  float fStack_e0;
  float fStack_dc;
  undefined8 local_d8;
  float fStack_d0;
  float fStack_cc;
  undefined8 local_c8;
  float fStack_c0;
  float fStack_bc;
  undefined8 local_b8;
  float fStack_b0;
  float fStack_ac;
  undefined8 local_a8;
  float fStack_a0;
  float fStack_9c;
  undefined8 local_98;
  float fStack_90;
  float fStack_8c;
  void *local_80;
  float local_78;
  int local_74;
  undefined8 *local_70;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_68;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_48;
  
  local_168 = _DAT_01feb9f0;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = _DAT_01feb9f0;
  local_178 = _DAT_01feba00;
  local_188._0_4_ = (undefined4)DAT_01feba00;
  *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
   (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper
   .field_0.m128 = _DAT_01feba00;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = local_168;
  *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
   (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper
   .field_0.m128 = local_178;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = local_168;
  *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
   (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
   .m128 = local_178;
  (__return_storage_ptr__->object_range)._begin = 0;
  (__return_storage_ptr__->object_range)._end = 0;
  (__return_storage_ptr__->max_time_range).lower = 0.0;
  __return_storage_ptr__->num_time_segments = 0;
  __return_storage_ptr__->max_num_time_segments = 0;
  *(undefined1 **)&(__return_storage_ptr__->max_time_range).upper = &DAT_3f8000003f800000;
  (__return_storage_ptr__->time_range).upper = 0.0;
  uVar10 = r->_begin;
  local_23c = (__return_storage_ptr__->time_range).lower;
  local_238 = 0.0;
  local_1b8 = __return_storage_ptr__->num_time_segments;
  local_200 = __return_storage_ptr__->max_num_time_segments;
  local_158 = __return_storage_ptr__->max_time_range;
  uStack_150 = 0;
  local_188._4_4_ = local_178.m128[1];
  fStack_180 = local_178.m128[2];
  fStack_17c = local_178.m128[3];
  local_100 = __return_storage_ptr__;
  local_48 = local_168;
  local_58 = local_178;
  local_68 = local_168;
  if (uVar10 < r->_end) {
    local_1c0 = (__return_storage_ptr__->object_range)._end;
    _local_188 = local_178.m128;
    local_1a8 = k;
    local_1a0 = t0t1;
    local_f8 = prims;
    local_f0 = r;
    do {
      BVar2 = (this->super_UserGeometry).super_AccelSet.super_Geometry.time_range;
      fVar6 = (this->super_UserGeometry).super_AccelSet.super_Geometry.fnumTimeSegments;
      fVar13 = local_1a0->upper;
      fVar17 = BVar2.lower;
      fVar24 = BVar2.upper - fVar17;
      auVar14._0_4_ = floorf(((local_1a0->lower - fVar17) / fVar24) * 1.0000002 * fVar6);
      fVar11 = 0.0;
      if (0.0 <= auVar14._0_4_) {
        fVar11 = auVar14._0_4_;
      }
      fVar11 = (float)(int)fVar11;
      fVar13 = ceilf(((fVar13 - fVar17) / fVar24) * 0.99999976 * fVar6);
      if (fVar6 <= fVar13) {
        fVar13 = fVar6;
      }
      fVar6 = (float)(int)fVar13;
      bVar12 = (uint)fVar6 < (uint)fVar11;
      fVar13 = (float)uVar10;
      if ((uint)fVar11 <= (uint)fVar6) {
        uVar9 = (ulong)(int)fVar11;
        do {
          local_1f8 = (this->super_UserGeometry).super_AccelSet.super_Geometry.userPtr;
          local_1e8 = &local_128;
          fStack_1f0 = fVar13;
          fStack_1ec = fVar11;
          uVar7 = (**(code **)&(this->super_UserGeometry).super_AccelSet.super_Geometry.field_0x58)
                            (&local_1f8);
          auVar15._0_4_ =
               -(uint)((local_118 < 1.844e+18 && -1.844e+18 < local_128) && local_128 <= local_118);
          auVar15._4_4_ =
               -(uint)((fStack_114 < 1.844e+18 && -1.844e+18 < fStack_124) &&
                      fStack_124 <= fStack_114);
          auVar15._8_4_ =
               -(uint)((fStack_110 < 1.844e+18 && -1.844e+18 < fStack_120) &&
                      fStack_120 <= fStack_110);
          auVar15._12_4_ =
               -(uint)((fStack_10c < 1.844e+18 && -1.844e+18 < fStack_11c) &&
                      fStack_11c <= fStack_10c);
          uVar7 = movmskps(uVar7,auVar15);
          if ((~(byte)uVar7 & 7) != 0) {
            if (!bVar12) goto LAB_00a1d259;
            break;
          }
          uVar9 = uVar9 + 1;
          fVar11 = (float)((int)fVar11 + 1);
          bVar12 = (ulong)(long)(int)fVar6 < uVar9;
        } while (uVar9 <= (ulong)(long)(int)fVar6);
      }
      fVar6 = (this->super_UserGeometry).super_AccelSet.super_Geometry.fnumTimeSegments;
      fVar11 = (this->super_UserGeometry).super_AccelSet.super_Geometry.time_range.lower;
      fVar17 = (this->super_UserGeometry).super_AccelSet.super_Geometry.time_range.upper - fVar11;
      fVar24 = (local_1a0->lower - fVar11) / fVar17;
      fVar17 = (local_1a0->upper - fVar11) / fVar17;
      local_1d8 = fVar6 * fVar17;
      fVar11 = floorf(fVar6 * fVar24);
      auVar14._0_4_ = ceilf(local_1d8);
      iVar8 = (int)fVar11;
      if (fVar11 <= 0.0) {
        fVar11 = 0.0;
      }
      fVar31 = auVar14._0_4_;
      if (fVar6 <= auVar14._0_4_) {
        fVar31 = fVar6;
      }
      register0x00001204 = extraout_var;
      local_198._0_4_ = fVar31;
      fStack_1ec = (float)(int)fVar11;
      if (iVar8 < 0) {
        iVar8 = -1;
      }
      iVar5 = (int)fVar6 + 1;
      if ((int)auVar14._0_4_ < (int)fVar6 + 1) {
        iVar5 = (int)auVar14._0_4_;
      }
      local_1f8 = (this->super_UserGeometry).super_AccelSet.super_Geometry.userPtr;
      local_1e8 = &local_128;
      fStack_1f0 = fVar13;
      local_148 = fStack_1ec;
      (**(code **)&(this->super_UserGeometry).super_AccelSet.super_Geometry.field_0x58)(&local_1f8);
      local_a8 = (this->super_UserGeometry).super_AccelSet.super_Geometry.userPtr;
      local_1b0 = uVar10;
      local_138 = (float)(int)fVar31;
      fStack_a0 = fVar13;
      fStack_9c = (float)(int)fVar31;
      local_98 = &local_1f8;
      (**(code **)&(this->super_UserGeometry).super_AccelSet.super_Geometry.field_0x58)(&local_a8);
      uVar10 = local_1b0;
      fVar11 = fVar6 * fVar24 - fVar11;
      fVar13 = (float)local_1b0;
      if (iVar5 - iVar8 == 1) {
        if (fVar11 <= 0.0) {
          fVar11 = 0.0;
        }
        fVar6 = 1.0 - fVar11;
        fVar31 = fVar6 * local_128 + fVar11 * (float)local_1f8;
        fVar32 = fVar6 * fStack_124 + fVar11 * local_1f8._4_4_;
        fVar33 = fVar6 * fStack_120 + fVar11 * fStack_1f0;
        auVar28._0_4_ = fVar6 * local_118 + fVar11 * (float)local_1e8;
        auVar28._4_4_ = fVar6 * fStack_114 + fVar11 * local_1e8._4_4_;
        auVar28._8_4_ = fVar6 * fStack_110 + fVar11 * fStack_1e0;
        fVar6 = (float)local_198._0_4_ - local_1d8;
        if (fVar6 <= 0.0) {
          fVar6 = 0.0;
        }
        fVar11 = 1.0 - fVar6;
        auVar14._0_4_ = (float)local_1f8 * fVar11 + local_128 * fVar6;
        auVar14._4_4_ = local_1f8._4_4_ * fVar11 + fStack_124 * fVar6;
        auVar14._8_4_ = fStack_1f0 * fVar11 + fStack_120 * fVar6;
        auVar19._0_4_ = fVar11 * (float)local_1e8 + fVar6 * local_118;
        auVar19._4_4_ = fVar11 * local_1e8._4_4_ + fVar6 * fStack_114;
        auVar19._8_4_ = fVar11 * fStack_1e0 + fVar6 * fStack_110;
      }
      else {
        fStack_bc = (float)((int)local_148 + 1);
        local_c8 = (this->super_UserGeometry).super_AccelSet.super_Geometry.userPtr;
        fStack_c0 = fVar13;
        local_b8 = &local_a8;
        (**(code **)&(this->super_UserGeometry).super_AccelSet.super_Geometry.field_0x58)(&local_c8)
        ;
        fStack_dc = (float)((int)local_138 + -1);
        local_e8 = (this->super_UserGeometry).super_AccelSet.super_Geometry.userPtr;
        fStack_e0 = fVar13;
        local_d8 = &local_c8;
        (**(code **)&(this->super_UserGeometry).super_AccelSet.super_Geometry.field_0x58)(&local_e8)
        ;
        if (fVar11 <= 0.0) {
          fVar11 = 0.0;
        }
        auVar14._0_4_ = 1.0 - fVar11;
        fVar31 = local_128 * auVar14._0_4_ + (float)local_a8 * fVar11;
        fVar32 = fStack_124 * auVar14._0_4_ + local_a8._4_4_ * fVar11;
        fVar33 = fStack_120 * auVar14._0_4_ + fStack_a0 * fVar11;
        fVar34 = fStack_11c * auVar14._0_4_ + fStack_9c * fVar11;
        auVar28._0_4_ = auVar14._0_4_ * local_118 + fVar11 * (float)local_98;
        auVar28._4_4_ = auVar14._0_4_ * fStack_114 + fVar11 * local_98._4_4_;
        auVar28._8_4_ = auVar14._0_4_ * fStack_110 + fVar11 * fStack_90;
        auVar29._12_4_ = auVar14._0_4_ * fStack_10c + fVar11 * fStack_8c;
        auVar29._0_12_ = auVar28;
        fVar11 = (float)local_198._0_4_ - local_1d8;
        if (fVar11 <= 0.0) {
          fVar11 = 0.0;
        }
        fVar26 = 1.0 - fVar11;
        auVar14._0_4_ = (float)local_1f8 * fVar26 + (float)local_c8 * fVar11;
        auVar14._4_4_ = local_1f8._4_4_ * fVar26 + local_c8._4_4_ * fVar11;
        auVar14._8_4_ = fStack_1f0 * fVar26 + fStack_c0 * fVar11;
        fVar35 = fStack_1ec * fVar26 + fStack_bc * fVar11;
        auVar27._0_8_ =
             CONCAT44(fVar26 * local_1e8._4_4_ + fVar11 * local_b8._4_4_,
                      fVar26 * (float)local_1e8 + fVar11 * (float)local_b8);
        auVar27._8_4_ = fVar26 * fStack_1e0 + fVar11 * fStack_b0;
        auVar27._12_4_ = fVar26 * fStack_1dc + fVar11 * fStack_ac;
        iVar8 = iVar8 + 1;
        if (iVar8 < iVar5) {
          do {
            fVar11 = ((float)iVar8 / fVar6 - fVar24) / (fVar17 - fVar24);
            fVar26 = 1.0 - fVar11;
            local_1d8 = fVar31 * fVar26 + auVar14._0_4_ * fVar11;
            fStack_1d4 = fVar32 * fVar26 + auVar14._4_4_ * fVar11;
            fStack_1d0 = fVar33 * fVar26 + auVar14._8_4_ * fVar11;
            fStack_1cc = fVar34 * fVar26 + fVar35 * fVar11;
            local_138 = fVar26 * auVar29._0_4_ + fVar11 * auVar27._0_4_;
            fStack_134 = fVar26 * auVar29._4_4_ + fVar11 * auVar27._4_4_;
            fStack_130 = fVar26 * auVar29._8_4_ + fVar11 * auVar27._8_4_;
            fStack_12c = fVar26 * auVar29._12_4_ + fVar11 * auVar27._12_4_;
            local_80 = (this->super_UserGeometry).super_AccelSet.super_Geometry.userPtr;
            _local_198 = auVar27;
            local_148 = auVar14._0_4_;
            fStack_144 = auVar14._4_4_;
            fStack_140 = auVar14._8_4_;
            fStack_13c = fVar35;
            local_78 = fVar13;
            local_74 = iVar8;
            local_70 = &local_e8;
            (**(code **)&(this->super_UserGeometry).super_AccelSet.super_Geometry.field_0x58)
                      (&local_80);
            auVar21._0_4_ = (float)local_e8 - local_1d8;
            auVar21._4_4_ = local_e8._4_4_ - fStack_1d4;
            auVar21._8_4_ = fStack_e0 - fStack_1d0;
            auVar21._12_4_ = fStack_dc - fStack_1cc;
            auVar20._0_4_ = (float)local_d8 - local_138;
            auVar20._4_4_ = local_d8._4_4_ - fStack_134;
            auVar20._8_4_ = fStack_d0 - fStack_130;
            auVar20._12_4_ = fStack_cc - fStack_12c;
            auVar15 = minps(auVar21,ZEXT816(0));
            auVar21 = maxps(auVar20,ZEXT816(0));
            fVar31 = fVar31 + auVar15._0_4_;
            fVar32 = fVar32 + auVar15._4_4_;
            fVar33 = fVar33 + auVar15._8_4_;
            fVar34 = fVar34 + auVar15._12_4_;
            auVar14._0_4_ = auVar15._0_4_ + local_148;
            auVar14._4_4_ = auVar15._4_4_ + fStack_144;
            auVar14._8_4_ = auVar15._8_4_ + fStack_140;
            fVar35 = auVar15._12_4_ + fStack_13c;
            auVar28._0_4_ = auVar29._0_4_ + auVar21._0_4_;
            auVar28._4_4_ = auVar29._4_4_ + auVar21._4_4_;
            auVar28._8_4_ = auVar29._8_4_ + auVar21._8_4_;
            auVar29._12_4_ = auVar29._12_4_ + auVar21._12_4_;
            auVar29._0_12_ = auVar28;
            auVar19._0_8_ =
                 CONCAT44(auVar21._4_4_ + (float)local_198._4_4_,
                          auVar21._0_4_ + (float)local_198._0_4_);
            auVar19._8_4_ = auVar21._8_4_ + fStack_190;
            iVar8 = iVar8 + 1;
            auVar27._8_4_ = auVar19._8_4_;
            auVar27._0_8_ = auVar19._0_8_;
            auVar27._12_4_ = auVar21._12_4_ + fStack_18c;
          } while (iVar5 != iVar8);
        }
        else {
          auVar19._8_4_ = auVar27._8_4_;
          auVar19._0_8_ = auVar27._0_8_;
        }
      }
      fVar6 = (float)((this->super_UserGeometry).super_AccelSet.super_Geometry.numTimeSteps - 1);
      uVar9 = (ulong)(uint)fVar6;
      aVar30.m128[3] = fVar13;
      aVar30._0_12_ = auVar28;
      aVar16.m128[3] = fVar6;
      aVar16._0_12_ = auVar14;
      aVar22.m128[3] = fVar6;
      aVar22._0_12_ = auVar19;
      auVar25._0_4_ = auVar28._0_4_ * 0.5 + auVar19._0_4_ * 0.5 + fVar31 * 0.5 + auVar14._0_4_ * 0.5
      ;
      auVar25._4_4_ = auVar28._4_4_ * 0.5 + auVar19._4_4_ * 0.5 + fVar32 * 0.5 + auVar14._4_4_ * 0.5
      ;
      auVar25._8_4_ = auVar28._8_4_ * 0.5 + auVar19._8_4_ * 0.5 + fVar33 * 0.5 + auVar14._8_4_ * 0.5
      ;
      auVar25._12_4_ = fVar13 * 0.5 + fVar6 * 0.5 + (float)geomID * 0.5 + fVar6 * 0.5;
      BVar2 = (this->super_UserGeometry).super_AccelSet.super_Geometry.time_range;
      fVar6 = BVar2.lower;
      fVar13 = BVar2.upper;
      auVar4._4_4_ = fVar32;
      auVar4._0_4_ = fVar31;
      auVar4._8_4_ = fVar33;
      auVar4._12_4_ = geomID;
      local_168.m128 = (__m128)minps(local_168.m128,auVar4);
      local_1c0 = local_1c0 + 1;
      local_1b8 = local_1b8 + uVar9;
      bVar12 = local_200 < uVar9;
      if (local_200 <= uVar9) {
        local_200 = uVar9;
      }
      pPVar3 = local_f8->items;
      pPVar1 = pPVar3 + local_1a8;
      (pPVar1->lbounds).bounds0.lower.field_0.m128[0] = fVar31;
      (pPVar1->lbounds).bounds0.lower.field_0.m128[1] = fVar32;
      (pPVar1->lbounds).bounds0.lower.field_0.m128[2] = fVar33;
      (pPVar1->lbounds).bounds0.lower.field_0.m128[3] = (float)geomID;
      local_178.m128 = (__m128)maxps(local_178.m128,aVar30.m128);
      pPVar3[local_1a8].lbounds.bounds0.upper.field_0 = aVar30;
      local_68.m128 = (__m128)minps(local_68.m128,aVar16.m128);
      pPVar3[local_1a8].lbounds.bounds1.lower.field_0 = aVar16;
      local_58.m128 = (__m128)maxps(local_58.m128,aVar22.m128);
      pPVar3[local_1a8].lbounds.bounds1.upper.field_0 = aVar22;
      pPVar3[local_1a8].time_range = BVar2;
      local_48.m128 = (__m128)minps(local_48.m128,auVar25);
      _local_188 = (__m128)maxps(_local_188,auVar25);
      if (fVar6 <= local_23c) {
        local_23c = fVar6;
      }
      fVar11 = fVar13;
      if (fVar13 <= local_238) {
        fVar11 = local_238;
      }
      uVar18 = (int)((uint)bVar12 << 0x1f) >> 0x1f;
      uVar23 = (int)((uint)bVar12 << 0x1f) >> 0x1f;
      local_1a8 = local_1a8 + 1;
      local_158.upper = (float)(~uVar23 & (uint)local_158.upper | (uint)fVar13 & uVar23);
      local_158.lower = (float)(~uVar18 & (uint)local_158.lower | (uint)fVar6 & uVar18);
      local_238 = fVar11;
LAB_00a1d259:
      uVar10 = uVar10 + 1;
    } while (uVar10 < local_f0->_end);
    (local_100->object_range)._end = local_1c0;
  }
  (local_100->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.field_0 =
       local_168;
  (local_100->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.field_0 =
       local_178;
  (local_100->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.field_0 =
       local_68;
  (local_100->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.field_0 =
       local_58;
  (local_100->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0 = local_48;
  (local_100->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0.m128[0] =
       (float)local_188._0_4_;
  (local_100->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0.m128[1] =
       (float)local_188._4_4_;
  (local_100->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0.m128[2] =
       fStack_180;
  (local_100->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0.m128[3] =
       fStack_17c;
  (local_100->time_range).lower = local_23c;
  (local_100->time_range).upper = local_238;
  local_100->num_time_segments = local_1b8;
  local_100->max_num_time_segments = local_200;
  local_100->max_time_range = local_158;
  return local_100;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfoMB pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(j, timeSegmentRange(t0t1))) continue;
          const PrimRefMB prim(linearBounds(j,t0t1),this->numTimeSegments(),this->time_range,this->numTimeSegments(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }